

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MooDb.hpp
# Opt level: O1

void __thiscall Table::Save(Table *this,string *fileName)

{
  pointer pcVar1;
  pointer pvVar2;
  long lVar3;
  pointer pbVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string tableColumns;
  CowConfig cfg;
  long *local_5a8;
  long local_5a0;
  long local_598 [2];
  size_type *local_588;
  long local_580;
  size_type local_578;
  long lStack_570;
  long *local_568;
  long local_560;
  long local_558 [2];
  string local_548;
  ulong local_528;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  CowConfig local_480;
  
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,pcVar1,pcVar1 + fileName->_M_string_length);
  CowConfig::CowConfig(&local_480,&local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  local_568 = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"");
  pbVar4 = (this->Columns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->Columns).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    lVar8 = 8;
    uVar12 = 0;
    do {
      lVar5 = *(long *)((long)pbVar4 + lVar8 + -8);
      local_5a8 = local_598;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5a8,lVar5,
                 *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8) + lVar5);
      std::__cxx11::string::append((char *)&local_5a8);
      std::__cxx11::string::_M_append((char *)&local_568,(ulong)local_5a8);
      if (local_5a8 != local_598) {
        operator_delete(local_5a8,local_598[0] + 1);
      }
      uVar12 = uVar12 + 1;
      pbVar4 = (this->Columns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar12 < (ulong)((long)(this->Columns).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5))
    ;
  }
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"");
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e0,local_568,local_560 + (long)local_568);
  CowConfig::WriteLine(&local_480,&local_4c0,&local_4e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((this->Data).
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->Data).
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      local_5a8 = local_598;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"","");
      pvVar2 = (this->Data).
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = pvVar2[uVar12].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_528 = uVar12;
      if (*(pointer *)
           ((long)&pvVar2[uVar12].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data + 8) != pbVar4) {
        lVar8 = 0;
        uVar11 = 0;
        do {
          lVar5 = std::__cxx11::string::find
                            ((char *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8),0x1071da,0);
          if (lVar5 == -1) {
            lVar5 = *(long *)&(this->Data).
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar12].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            lVar3 = *(long *)(lVar5 + lVar8);
            local_588 = &local_578;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_588,lVar3,*(long *)(lVar5 + 8 + lVar8) + lVar3);
            std::__cxx11::string::append((char *)&local_588);
            std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_588);
            uVar9 = local_578;
            _Var10._M_p = (pointer)local_588;
            if (local_588 != &local_578) goto LAB_0010403c;
          }
          else {
            std::operator+(&local_500,"\"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)&(this->Data).
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + lVar8));
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_500);
            psVar7 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar7) {
              local_578 = *psVar7;
              lStack_570 = plVar6[3];
              local_588 = &local_578;
            }
            else {
              local_578 = *psVar7;
              local_588 = (size_type *)*plVar6;
            }
            local_580 = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_588);
            if (local_588 != &local_578) {
              operator_delete(local_588,local_578 + 1);
            }
            uVar9 = local_500.field_2._M_allocated_capacity;
            _Var10._M_p = local_500._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
LAB_0010403c:
              operator_delete(_Var10._M_p,uVar9 + 1);
            }
          }
          uVar11 = uVar11 + 1;
          pvVar2 = (this->Data).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = pvVar2[uVar12].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x20;
        } while (uVar11 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[uVar12].
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pbVar4 >> 5));
      }
      local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"","");
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_520,local_5a8,local_5a0 + (long)local_5a8);
      CowConfig::WriteLine(&local_480,&local_548,&local_520);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
      }
      uVar12 = local_528;
      if (local_5a8 != local_598) {
        operator_delete(local_5a8,local_598[0] + 1);
      }
      uVar12 = uVar12 + 1;
      uVar11 = ((long)(this->Data).
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Data).
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar12 <= uVar11 && uVar11 - uVar12 != 0);
  }
  if (local_568 != local_558) {
    operator_delete(local_568,local_558[0] + 1);
  }
  CowConfig::~CowConfig(&local_480);
  return;
}

Assistant:

void Save(std::string fileName){
		CowConfig cfg(fileName);
		std::string tableColumns = "";
		for (int p = 0; p < Columns.size(); p++)
			tableColumns += Columns[p] + ",";
		cfg.WriteLine("", tableColumns);

		for (int p = 0; p < Data.size(); p++){
			std::string rowData = "";
			for (int q = 0; q < Data[p].size(); q++){
				if (Data[p][q].find(",") != std::string::npos)
					rowData += "\"" + Data[p][q] + "\",";
				else
					rowData += Data[p][q] + ",";
			} // looping horizontally
			cfg.WriteLine("", rowData);
		} // looping vertically
	}